

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O2

int ImfHeaderSetV2iAttribute(ImfHeader *hdr,char *name,int x,int y)

{
  Iterator IVar1;
  iterator iVar2;
  TypedAttribute<Imath_3_2::Vec2<int>_> *pTVar3;
  V2i v;
  TypedAttribute<Imath_3_2::Vec2<int>_> local_38;
  
  v.x = x;
  v.y = y;
  IVar1 = Imf_3_4::Header::find((Header *)hdr,name);
  iVar2._M_node = (_Base_ptr)Imf_3_4::Header::end((Header *)hdr);
  if (IVar1._i._M_node == (iterator)iVar2._M_node) {
    Imf_3_4::TypedAttribute<Imath_3_2::Vec2<int>_>::TypedAttribute(&local_38,&v);
    Imf_3_4::Header::insert((Header *)hdr,name,&local_38.super_Attribute);
    Imf_3_4::TypedAttribute<Imath_3_2::Vec2<int>_>::~TypedAttribute(&local_38);
  }
  else {
    pTVar3 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Vec2<int>>>
                       ((Header *)hdr,name);
    (pTVar3->_value).x = x;
    (pTVar3->_value).y = y;
  }
  return 1;
}

Assistant:

int
ImfHeaderSetV2iAttribute (ImfHeader* hdr, const char name[], int x, int y)
{
    try
    {
        V2i v (x, y);

        if (header (hdr)->find (name) == header (hdr)->end ())
            header (hdr)->insert (
                name, OPENEXR_IMF_INTERNAL_NAMESPACE::V2iAttribute (v));
        else
            header (hdr)
                ->typedAttribute<OPENEXR_IMF_INTERNAL_NAMESPACE::V2iAttribute> (
                    name)
                .value () = v;

        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}